

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::peer_connection::can_read(peer_connection *this)

{
  byte bVar1;
  bool bVar2;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> _Stack_18;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_18,&(this->super_peer_connection_hot_members).m_torrent);
  if ((this->m_quota[1] < 1) ||
     ((0 < this->m_outstanding_bytes &&
      (((this->m_channel_state).
        super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
        ._M_elems[1].m_val & 0x10) != 0)))) {
    bVar2 = false;
  }
  else {
    bVar1 = (this->super_peer_connection_hot_members).field_0x28;
    bVar2 = (bool)((bVar1 ^ 1) & (bVar1 & 2) == 0);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18._M_refcount);
  return bVar2;
}

Assistant:

bool peer_connection::can_read()
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();

		bool bw_limit = m_quota[download_channel] > 0;

		if (!bw_limit) return false;

		if (m_outstanding_bytes > 0)
		{
			// if we're expecting to download piece data, we might not
			// want to read from the socket in case we're out of disk
			// cache space right now

			if (m_channel_state[download_channel] & peer_info::bw_disk) return false;
		}

		return !m_connecting && !m_disconnecting;
	}